

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxxopts.hpp
# Opt level: O0

void __thiscall cxxopts::OptionException::~OptionException(OptionException *this)

{
  OptionException *this_local;
  
  *(undefined ***)this = &PTR__OptionException_00372650;
  std::__cxx11::string::~string((string *)&this->m_message);
  std::exception::~exception(&this->super_exception);
  return;
}

Assistant:

explicit OptionException(std::string  message)
    : m_message(std::move(message))
    {
    }